

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O0

int repack_q4_0_to_q4_0_4_bl(ggml_tensor *t,int interleave_block,void *data,size_t data_size)

{
  void *__dest;
  int iVar1;
  int iVar2;
  long in_RCX;
  undefined8 *puVar3;
  long in_RDX;
  long lVar4;
  int in_ESI;
  int *in_RDI;
  int i;
  int64_t x;
  int b;
  int nblocks;
  int nrow;
  block_q4_0 dst_tmp [4];
  block_q4_0 *src;
  block_q4_0x4 *dst;
  int nrows_interleaved;
  undefined1 local_ec [72];
  uint blck_size_interleave;
  block_q4_0 *in;
  int local_94;
  undefined8 local_88 [2];
  undefined2 auStack_78 [28];
  long local_40;
  void *local_38;
  undefined4 local_2c;
  long local_28;
  int *local_10;
  int local_4;
  
  if (*in_RDI != 2) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
               ,0x16a4,"GGML_ASSERT(%s) failed","t->type == GGML_TYPE_Q4_0");
  }
  if ((in_ESI != 4) && (in_ESI != 8)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
               ,0x16a5,"GGML_ASSERT(%s) failed","interleave_block == 4 || interleave_block == 8");
  }
  local_2c = 4;
  local_38 = *(void **)(in_RDI + 0x3e);
  local_40 = in_RDX;
  local_28 = in_RCX;
  local_10 = in_RDI;
  iVar1 = ggml_nrows(in_RDI);
  iVar2 = (int)(*(long *)(local_10 + 4) / 0x20);
  if (local_28 != (long)(iVar1 * iVar2) * 0x12) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
               ,0x16ae,"GGML_ASSERT(%s) failed","data_size == nrow * nblocks * sizeof(block_q4_0)");
  }
  if ((*(long *)(local_10 + 6) % 4 == 0) && (*(long *)(local_10 + 4) % 8 == 0)) {
    for (local_94 = 0; local_94 < iVar1; local_94 = local_94 + 4) {
      for (in = (block_q4_0 *)0x0; (long)in < (long)iVar2; in = (block_q4_0 *)((long)&in->d + 1)) {
        for (blck_size_interleave = 0; (int)blck_size_interleave < 4;
            blck_size_interleave = blck_size_interleave + 1) {
          puVar3 = (undefined8 *)
                   (local_40 +
                   (long)(in->qs + (long)(int)(blck_size_interleave * iVar2) + -2) * 0x12);
          lVar4 = (long)(int)blck_size_interleave * 0x12;
          *(undefined8 *)((long)local_88 + lVar4) = *puVar3;
          *(undefined8 *)((long)local_88 + lVar4 + 8) = puVar3[1];
          auStack_78[(long)(int)blck_size_interleave * 9] = *(undefined2 *)(puVar3 + 2);
        }
        make_block_q4_0x4(in,blck_size_interleave);
        __dest = local_38;
        local_38 = (void *)((long)local_38 + 0x48);
        memcpy(__dest,local_ec,0x48);
      }
      local_40 = local_40 + (long)(iVar2 << 2) * 0x12;
    }
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int repack_q4_0_to_q4_0_4_bl(struct ggml_tensor * t, int interleave_block, const void * GGML_RESTRICT data, size_t data_size) {
    GGML_ASSERT(t->type == GGML_TYPE_Q4_0);
    GGML_ASSERT(interleave_block == 4 || interleave_block == 8);
    constexpr int nrows_interleaved = 4;

    block_q4_0x4 * dst = (block_q4_0x4 *)t->data;
    const block_q4_0 * src = (const block_q4_0 *)data;
    block_q4_0 dst_tmp[4];
    int nrow = ggml_nrows(t);
    int nblocks = t->ne[0] / QK4_0;

    GGML_ASSERT(data_size == nrow * nblocks * sizeof(block_q4_0));

    if (t->ne[1] % nrows_interleaved != 0 || t->ne[0] % 8 != 0) {
        return -1;
    }

    for (int b = 0; b < nrow; b += nrows_interleaved) {
        for (int64_t x = 0; x < nblocks; x++) {
            for (int i = 0; i < nrows_interleaved; i++) {
                dst_tmp[i] = src[x + i * nblocks];
            }
            *dst++ = make_block_q4_0x4(dst_tmp, interleave_block);
        }
        src += nrows_interleaved * nblocks;
    }
    return 0;

    GGML_UNUSED(data_size);
}